

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::_::ArrayDisposableOwnedBundle<kj::Array<unsigned_char>_>::disposeImpl
          (ArrayDisposableOwnedBundle<kj::Array<unsigned_char>_> *this,void *param_1,size_t param_2,
          size_t param_3,size_t param_4,_func_void_void_ptr *param_5)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  puVar1 = (this->super_OwnedBundle<kj::Array<unsigned_char>_>).first.ptr;
  if (puVar1 != (uchar *)0x0) {
    sVar2 = (this->super_OwnedBundle<kj::Array<unsigned_char>_>).first.size_;
    (this->super_OwnedBundle<kj::Array<unsigned_char>_>).first.ptr = (uchar *)0x0;
    (this->super_OwnedBundle<kj::Array<unsigned_char>_>).first.size_ = 0;
    pAVar3 = (this->super_OwnedBundle<kj::Array<unsigned_char>_>).first.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

void disposeImpl(void*, size_t, size_t, size_t, void (*)(void*)) const override { delete this; }